

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignerInfo.c
# Opt level: O1

HCOSE_SIGNER COSE_Signer_Init(cose_errback *perror)

{
  _Bool _Var1;
  COSE *pobj;
  
  pobj = (COSE *)calloc(1,0x68);
  if (pobj == (COSE *)0x0) {
    if (perror != (cose_errback *)0x0) {
      perror->err = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    _Var1 = _COSE_Init(COSE_INIT_FLAGS_NO_CBOR_TAG,pobj,-1,perror);
    if (_Var1) {
      _COSE_InsertInList(&SignerRoot,pobj);
      return (HCOSE_SIGNER)pobj;
    }
    if (pobj->m_refCount < 2) {
      _COSE_Release(pobj);
    }
    else {
      pobj->m_refCount = pobj->m_refCount + -1;
    }
    free(pobj);
  }
  return (HCOSE_SIGNER)0x0;
}

Assistant:

HCOSE_SIGNER COSE_Signer_Init(CBOR_CONTEXT_COMMA cose_errback * perror)
{
	COSE_SignerInfo * pobj = (COSE_SignerInfo *)COSE_CALLOC(1, sizeof(COSE_SignerInfo), context);
	if (pobj == NULL) {
		if (perror != NULL) perror->err = COSE_ERR_OUT_OF_MEMORY;
		return NULL;
	}

	if (!_COSE_SignerInfo_Init(COSE_INIT_FLAGS_NO_CBOR_TAG, pobj, COSE_recipient_object, CBOR_CONTEXT_PARAM_COMMA perror)) {
		_COSE_SignerInfo_Free(pobj);
		COSE_FREE(pobj, context);
		return NULL;
	}

	_COSE_InsertInList(&SignerRoot, &pobj->m_message);
	return (HCOSE_SIGNER)pobj;
}